

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 byteLength;
  int iVar4;
  undefined4 *puVar5;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar6;
  undefined4 extraout_var;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint64 index;
  long lVar7;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x233d,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) goto LAB_00969057;
    *puVar5 = 0;
  }
  uVar9 = playout->Offset;
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar6 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength = (*(pAVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar6);
  iVar4 = (*(pAVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar6);
  lVar7 = CONCAT44(extraout_var,iVar4);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x234b,"((0))","UNREACHED");
    if (bVar3) {
      *puVar5 = 0;
      return;
    }
LAB_00969057:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  index = (ulong)uVar1 + (ulong)uVar9;
  switch(playout->ViewType) {
  case TYPE_INT8:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    uVar10 = (ulong)playout->Value;
    uVar9 = (uint)*(char *)(lVar7 + index);
    goto LAB_00968fc0;
  case TYPE_UINT8:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
    uVar10 = (ulong)playout->Value;
    uVar9 = (uint)*(byte *)(lVar7 + index);
    goto LAB_00968fc0;
  case TYPE_INT16:
    WasmArrayBoundsCheck<short>(this,index,byteLength);
    uVar10 = (ulong)playout->Value;
    uVar9 = (uint)*(short *)(lVar7 + index);
    goto LAB_00968fc0;
  case TYPE_UINT16:
    WasmArrayBoundsCheck<unsigned_short>(this,index,byteLength);
    uVar10 = (ulong)playout->Value;
    uVar9 = (uint)*(ushort *)(lVar7 + index);
    goto LAB_00968fc0;
  case TYPE_INT32:
    WasmArrayBoundsCheck<int>(this,index,byteLength);
    goto LAB_00968fb7;
  case TYPE_UINT32:
    WasmArrayBoundsCheck<unsigned_int>(this,index,byteLength);
LAB_00968fb7:
    uVar10 = (ulong)playout->Value;
    uVar9 = *(uint *)(lVar7 + index);
LAB_00968fc0:
    *(uint *)(*(long *)(this + 0x118) + uVar10 * 4) = uVar9;
    return;
  case TYPE_FLOAT32:
    WasmArrayBoundsCheck<float>(this,index,byteLength);
    *(undefined4 *)(*(long *)(this + 0x130) + (ulong)playout->Value * 4) =
         *(undefined4 *)(lVar7 + index);
    return;
  case TYPE_FLOAT64:
    WasmArrayBoundsCheck<double>(this,index,byteLength);
    *(undefined8 *)(*(long *)(this + 0x128) + (ulong)playout->Value * 8) =
         *(undefined8 *)(lVar7 + index);
    return;
  case TYPE_INT64:
    WasmArrayBoundsCheck<long>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = *(ulong *)(lVar7 + index);
    break;
  case TYPE_INT8_TO_INT64:
    WasmArrayBoundsCheck<char>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(char *)(lVar7 + index);
    break;
  case TYPE_UINT8_TO_INT64:
    WasmArrayBoundsCheck<unsigned_char>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(byte *)(lVar7 + index);
    break;
  case TYPE_INT16_TO_INT64:
    WasmArrayBoundsCheck<short>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(short *)(lVar7 + index);
    break;
  case TYPE_UINT16_TO_INT64:
    WasmArrayBoundsCheck<unsigned_short>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(ushort *)(lVar7 + index);
    break;
  case TYPE_INT32_TO_INT64:
    WasmArrayBoundsCheck<int>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(int *)(lVar7 + index);
    break;
  case TYPE_UINT32_TO_INT64:
    WasmArrayBoundsCheck<unsigned_int>(this,index,byteLength);
    uVar8 = (ulong)playout->Value;
    uVar10 = (ulong)*(uint *)(lVar7 + index);
  }
  *(ulong *)(*(long *)(this + 0x120) + uVar8 * 8) = uVar10;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            SetRegRaw<RegType>(playout->Value, (RegType)*(MemType*)(buffer + index)); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }